

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_entities(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  xmlDocPtr pxVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  xmlEntityPtr pxVar11;
  xmlBufferPtr pxVar12;
  xmlDocPtr pxVar13;
  long lVar14;
  uint uVar15;
  int nr;
  int nr_00;
  int extraout_EDX;
  int nr_01;
  int nr_02;
  int nr_03;
  int n_buf;
  uint uVar16;
  int test_ret;
  uint uVar17;
  xmlDocPtr in_RSI;
  bool bVar18;
  uint uVar19;
  int n_doc;
  uint uVar20;
  undefined1 auVar21 [12];
  int local_5c;
  int local_58;
  int test_ret_1;
  int local_4c;
  int local_3c;
  int test_ret_4;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing entities : 11 of 17 functions ...");
  }
  local_3c = 0;
  for (uVar17 = 0; uVar17 != 4; uVar17 = uVar17 + 1) {
    for (uVar20 = 0; uVar20 != 5; uVar20 = uVar20 + 1) {
      for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
        for (uVar1 = 0; uVar1 != 5; uVar1 = uVar1 + 1) {
          for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
            for (uVar19 = 0; iVar4 = (int)in_RSI, uVar19 != 5; uVar19 = uVar19 + 1) {
              iVar2 = xmlMemBlocks();
              pxVar7 = gen_xmlDocPtr(uVar17,iVar4);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar20,iVar4);
              iVar3 = gen_int(uVar16,iVar4);
              pxVar8 = gen_const_xmlChar_ptr(uVar1,iVar4);
              pxVar9 = gen_const_xmlChar_ptr(uVar15,iVar4);
              pxVar10 = gen_const_xmlChar_ptr(uVar19,iVar4);
              pxVar11 = (xmlEntityPtr)xmlAddDocEntity(pxVar7,in_RSI,iVar3,pxVar8,pxVar9,pxVar10);
              desret_xmlEntityPtr(pxVar11);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar7,in_RSI,nr);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar2 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDocEntity",(ulong)(uint)(iVar4 - iVar2));
                local_3c = local_3c + 1;
                printf(" %d",(ulong)uVar17);
                printf(" %d",(ulong)uVar20);
                printf(" %d",(ulong)uVar16);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar15);
                in_RSI = (xmlDocPtr)(ulong)uVar19;
                printf(" %d");
                putchar(10);
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_58 = 0;
  for (uVar17 = 0; uVar17 != 4; uVar17 = uVar17 + 1) {
    for (uVar20 = 0; uVar20 != 5; uVar20 = uVar20 + 1) {
      for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
        for (uVar1 = 0; uVar1 != 5; uVar1 = uVar1 + 1) {
          for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
            for (uVar19 = 0; iVar4 = (int)in_RSI, uVar19 != 5; uVar19 = uVar19 + 1) {
              iVar2 = xmlMemBlocks();
              pxVar7 = gen_xmlDocPtr(uVar17,iVar4);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar20,iVar4);
              iVar3 = gen_int(uVar16,iVar4);
              pxVar8 = gen_const_xmlChar_ptr(uVar1,iVar4);
              pxVar9 = gen_const_xmlChar_ptr(uVar15,iVar4);
              pxVar10 = gen_const_xmlChar_ptr(uVar19,iVar4);
              pxVar11 = (xmlEntityPtr)xmlAddDtdEntity(pxVar7,in_RSI,iVar3,pxVar8,pxVar9,pxVar10);
              desret_xmlEntityPtr(pxVar11);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar7,in_RSI,nr_00);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar2 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlAddDtdEntity",(ulong)(uint)(iVar4 - iVar2));
                local_58 = local_58 + 1;
                printf(" %d",(ulong)uVar17);
                printf(" %d",(ulong)uVar20);
                printf(" %d",(ulong)uVar16);
                printf(" %d",(ulong)uVar1);
                printf(" %d",(ulong)uVar15);
                in_RSI = (xmlDocPtr)(ulong)uVar19;
                printf(" %d");
                putchar(10);
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  iVar2 = 0;
  do {
    if (iVar4 == 3) {
      function_tests = function_tests + 1;
      iVar4 = 0;
      test_ret_1 = 0;
      do {
        if (iVar4 == 3) {
          function_tests = function_tests + 1;
          local_4c = 0;
          for (uVar17 = 0; uVar17 != 4; uVar17 = uVar17 + 1) {
            pxVar7 = (xmlDocPtr)0x0;
            while( true ) {
              iVar4 = (int)in_RSI;
              iVar3 = (int)pxVar7;
              if (iVar3 == 5) break;
              iVar5 = xmlMemBlocks();
              pxVar13 = gen_xmlDocPtr(uVar17,iVar4);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar3,iVar4);
              auVar21 = xmlEncodeEntitiesReentrant(pxVar13);
              iVar4 = auVar21._8_4_;
              if (auVar21._0_8_ != 0) {
                (*_xmlFree)(auVar21._0_8_);
                iVar4 = extraout_EDX;
              }
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar13,in_RSI,iVar4);
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar5 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlEncodeEntitiesReentrant",
                       (ulong)(uint)(iVar4 - iVar5));
                local_4c = local_4c + 1;
                printf(" %d",(ulong)uVar17);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar7;
              }
              pxVar7 = (xmlDocPtr)(ulong)(iVar3 + 1);
            }
          }
          function_tests = function_tests + 1;
          bVar18 = true;
          local_5c = 0;
          while (bVar18) {
            for (uVar17 = 0; iVar4 = (int)in_RSI, uVar17 != 5; uVar17 = uVar17 + 1) {
              iVar3 = xmlMemBlocks();
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar17,iVar4);
              lVar14 = xmlEncodeSpecialChars(0);
              if (lVar14 != 0) {
                (*_xmlFree)(lVar14);
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar3 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlEncodeSpecialChars",
                       (ulong)(uint)(iVar4 - iVar3));
                local_5c = local_5c + 1;
                printf(" %d",0);
                in_RSI = (xmlDocPtr)(ulong)uVar17;
                printf(" %d");
                putchar(10);
              }
            }
            bVar18 = false;
          }
          iVar4 = local_58 + local_3c + iVar2 + test_ret_1;
          function_tests = function_tests + 1;
          bVar18 = true;
          test_ret_1 = 0;
          while (bVar18) {
            for (uVar17 = 0; iVar2 = (int)in_RSI, uVar17 != 5; uVar17 = uVar17 + 1) {
              iVar3 = xmlMemBlocks();
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar17,iVar2);
              pxVar11 = (xmlEntityPtr)xmlGetDocEntity(0);
              desret_xmlEntityPtr(pxVar11);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar3 != iVar2) {
                iVar2 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlGetDocEntity",(ulong)(uint)(iVar2 - iVar3));
                test_ret_1 = test_ret_1 + 1;
                printf(" %d",0);
                in_RSI = (xmlDocPtr)(ulong)uVar17;
                printf(" %d");
                putchar(10);
              }
            }
            bVar18 = false;
          }
          function_tests = function_tests + 1;
          iVar2 = 0;
          for (uVar17 = 0; uVar17 != 4; uVar17 = uVar17 + 1) {
            pxVar7 = (xmlDocPtr)0x0;
            while( true ) {
              iVar3 = (int)in_RSI;
              iVar5 = (int)pxVar7;
              if (iVar5 == 5) break;
              iVar6 = xmlMemBlocks();
              pxVar13 = gen_xmlDocPtr(uVar17,iVar3);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar5,iVar3);
              pxVar11 = (xmlEntityPtr)xmlGetDtdEntity(pxVar13);
              desret_xmlEntityPtr(pxVar11);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar13,in_RSI,nr_01);
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar6 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlGetDtdEntity",(ulong)(uint)(iVar3 - iVar6));
                iVar2 = iVar2 + 1;
                printf(" %d",(ulong)uVar17);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar7;
              }
              pxVar7 = (xmlDocPtr)(ulong)(iVar5 + 1);
            }
          }
          function_tests = function_tests + 1;
          local_34 = 0;
          for (uVar17 = 0; uVar17 != 4; uVar17 = uVar17 + 1) {
            pxVar7 = (xmlDocPtr)0x0;
            while( true ) {
              iVar3 = (int)in_RSI;
              iVar5 = (int)pxVar7;
              if (iVar5 == 5) break;
              iVar6 = xmlMemBlocks();
              pxVar13 = gen_xmlDocPtr(uVar17,iVar3);
              in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar5,iVar3);
              pxVar11 = (xmlEntityPtr)xmlGetParameterEntity(pxVar13);
              desret_xmlEntityPtr(pxVar11);
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar13,in_RSI,nr_02);
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar6 != iVar3) {
                iVar3 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlGetParameterEntity",
                       (ulong)(uint)(iVar3 - iVar6));
                local_34 = local_34 + 1;
                printf(" %d",(ulong)uVar17);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar7;
              }
              pxVar7 = (xmlDocPtr)(ulong)(iVar5 + 1);
            }
          }
          function_tests = function_tests + 1;
          test_ret_4 = 0;
          for (uVar17 = 0; uVar17 != 5; uVar17 = uVar17 + 1) {
            iVar3 = xmlMemBlocks();
            pxVar8 = gen_const_xmlChar_ptr(uVar17,(int)in_RSI);
            pxVar11 = (xmlEntityPtr)xmlGetPredefinedEntity(pxVar8);
            desret_xmlEntityPtr(pxVar11);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar3 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlGetPredefinedEntity",
                     (ulong)(uint)(iVar5 - iVar3));
              test_ret_4 = test_ret_4 + 1;
              in_RSI = (xmlDocPtr)(ulong)uVar17;
              printf(" %d");
              putchar(10);
            }
          }
          function_tests = function_tests + 1;
          local_3c = 0;
          for (uVar17 = 0; uVar17 != 4; uVar17 = uVar17 + 1) {
            for (uVar20 = 0; uVar20 != 5; uVar20 = uVar20 + 1) {
              for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
                for (uVar1 = 0; uVar1 != 5; uVar1 = uVar1 + 1) {
                  for (uVar15 = 0; uVar15 != 5; uVar15 = uVar15 + 1) {
                    for (uVar19 = 0; iVar3 = (int)in_RSI, uVar19 != 5; uVar19 = uVar19 + 1) {
                      iVar5 = xmlMemBlocks();
                      pxVar7 = gen_xmlDocPtr(uVar17,iVar3);
                      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar20,iVar3);
                      iVar6 = gen_int(uVar16,iVar3);
                      pxVar8 = gen_const_xmlChar_ptr(uVar1,iVar3);
                      pxVar9 = gen_const_xmlChar_ptr(uVar15,iVar3);
                      pxVar10 = gen_const_xmlChar_ptr(uVar19,iVar3);
                      pxVar11 = (xmlEntityPtr)
                                xmlNewEntity(pxVar7,in_RSI,iVar6,pxVar8,pxVar9,pxVar10);
                      desret_xmlEntityPtr(pxVar11);
                      call_tests = call_tests + 1;
                      des_xmlDocPtr((int)pxVar7,in_RSI,nr_03);
                      xmlResetLastError();
                      iVar3 = xmlMemBlocks();
                      if (iVar5 != iVar3) {
                        iVar3 = xmlMemBlocks();
                        printf("Leak of %d blocks found in xmlNewEntity",
                               (ulong)(uint)(iVar3 - iVar5));
                        local_3c = local_3c + 1;
                        printf(" %d",(ulong)uVar17);
                        printf(" %d",(ulong)uVar20);
                        printf(" %d",(ulong)uVar16);
                        printf(" %d",(ulong)uVar1);
                        printf(" %d",(ulong)uVar15);
                        in_RSI = (xmlDocPtr)(ulong)uVar19;
                        printf(" %d");
                        putchar(10);
                      }
                    }
                  }
                }
              }
            }
          }
          function_tests = function_tests + 1;
          uVar17 = iVar4 + local_4c + local_5c + test_ret_1 + iVar2 + local_34 + test_ret_4 +
                   local_3c;
          if (uVar17 != 0) {
            printf("Module entities: %d errors\n",(ulong)uVar17);
          }
          return uVar17;
        }
        bVar18 = true;
        while (iVar3 = (int)in_RSI, bVar18) {
          iVar5 = xmlMemBlocks();
          pxVar12 = gen_xmlBufferPtr(iVar4,iVar3);
          in_RSI = (xmlDocPtr)0x0;
          xmlDumpEntityDecl(pxVar12);
          call_tests = call_tests + 1;
          if (pxVar12 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar12);
          }
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar5 == iVar3) break;
          iVar3 = xmlMemBlocks();
          bVar18 = false;
          printf("Leak of %d blocks found in xmlDumpEntityDecl",(ulong)(uint)(iVar3 - iVar5));
          test_ret_1 = test_ret_1 + 1;
          printf(" %d");
          in_RSI = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar4 = iVar4 + 1;
      } while( true );
    }
    bVar18 = true;
    while (iVar3 = (int)in_RSI, bVar18) {
      iVar5 = xmlMemBlocks();
      pxVar12 = gen_xmlBufferPtr(iVar4,iVar3);
      in_RSI = (xmlDocPtr)0x0;
      xmlDumpEntitiesTable(pxVar12);
      call_tests = call_tests + 1;
      if (pxVar12 != (xmlBufferPtr)0x0) {
        xmlBufferFree(pxVar12);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar5 == iVar3) break;
      iVar3 = xmlMemBlocks();
      bVar18 = false;
      printf("Leak of %d blocks found in xmlDumpEntitiesTable",(ulong)(uint)(iVar3 - iVar5));
      iVar2 = iVar2 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

static int
test_entities(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing entities : 11 of 17 functions ...\n");
    test_ret += test_xmlAddDocEntity();
    test_ret += test_xmlAddDtdEntity();
    test_ret += test_xmlCopyEntitiesTable();
    test_ret += test_xmlCreateEntitiesTable();
    test_ret += test_xmlDumpEntitiesTable();
    test_ret += test_xmlDumpEntityDecl();
    test_ret += test_xmlEncodeEntitiesReentrant();
    test_ret += test_xmlEncodeSpecialChars();
    test_ret += test_xmlGetDocEntity();
    test_ret += test_xmlGetDtdEntity();
    test_ret += test_xmlGetParameterEntity();
    test_ret += test_xmlGetPredefinedEntity();
    test_ret += test_xmlNewEntity();

    if (test_ret != 0)
	printf("Module entities: %d errors\n", test_ret);
    return(test_ret);
}